

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ehooks.h
# Opt level: O2

void * ehooks_alloc(tsdn_t *tsdn,ehooks_t *ehooks,void *new_addr,size_t size,size_t alignment,
                   _Bool *zero,_Bool *commit)

{
  extent_hooks_t *peVar1;
  void *pvVar2;
  
  peVar1 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar1 == &duckdb_je_ehooks_default_extent_hooks) {
    pvVar2 = duckdb_je_ehooks_default_alloc_impl
                       (tsdn,new_addr,size,alignment,zero,commit,ehooks->ind);
  }
  else {
    ehooks_pre_reentrancy(tsdn);
    pvVar2 = (*peVar1->alloc)(peVar1,new_addr,size,alignment,zero,commit,ehooks->ind);
    ehooks_post_reentrancy(tsdn);
  }
  return pvVar2;
}

Assistant:

static inline void *
ehooks_alloc(tsdn_t *tsdn, ehooks_t *ehooks, void *new_addr, size_t size,
    size_t alignment, bool *zero, bool *commit) {
	bool orig_zero = *zero;
	void *ret;
	extent_hooks_t *extent_hooks = ehooks_get_extent_hooks_ptr(ehooks);
	if (extent_hooks == &ehooks_default_extent_hooks) {
		ret = ehooks_default_alloc_impl(tsdn, new_addr, size,
		    alignment, zero, commit, ehooks_ind_get(ehooks));
	} else {
		ehooks_pre_reentrancy(tsdn);
		ret = extent_hooks->alloc(extent_hooks, new_addr, size,
		    alignment, zero, commit, ehooks_ind_get(ehooks));
		ehooks_post_reentrancy(tsdn);
	}
	assert(new_addr == NULL || ret == NULL || new_addr == ret);
	assert(!orig_zero || *zero);
	if (*zero && ret != NULL) {
		ehooks_debug_zero_check(ret, size);
	}
	return ret;
}